

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdsample.c
# Opt level: O0

void h2v1_fancy_upsample(j_decompress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY input_data,
                        JSAMPARRAY *output_data_ptr)

{
  byte bVar1;
  JSAMPARRAY ppJVar2;
  byte *pbVar3;
  int inrow;
  JDIMENSION colctr;
  int invalue;
  JSAMPROW outptr;
  JSAMPROW inptr;
  JSAMPARRAY output_data;
  JSAMPARRAY *output_data_ptr_local;
  JSAMPARRAY input_data_local;
  jpeg_component_info *compptr_local;
  j_decompress_ptr cinfo_local;
  
  ppJVar2 = *output_data_ptr;
  for (inrow = 0; inrow < cinfo->max_v_samp_factor; inrow = inrow + 1) {
    pbVar3 = ppJVar2[inrow];
    inptr = input_data[inrow] + 1;
    bVar1 = *input_data[inrow];
    *pbVar3 = bVar1;
    pbVar3[1] = (byte)((int)((uint)bVar1 * 3 + (uint)*inptr + 2) >> 2);
    for (colctr = compptr->downsampled_width - 2; outptr = pbVar3 + 2, colctr != 0;
        colctr = colctr - 1) {
      bVar1 = *inptr;
      *outptr = (JSAMPLE)((int)((uint)bVar1 * 3 + (uint)inptr[-1] + 1) >> 2);
      pbVar3[3] = (byte)((int)((uint)bVar1 * 3 + (uint)inptr[1] + 2) >> 2);
      inptr = inptr + 1;
      pbVar3 = outptr;
    }
    bVar1 = *inptr;
    *outptr = (JSAMPLE)((int)((uint)bVar1 * 3 + (uint)inptr[-1] + 1) >> 2);
    pbVar3[3] = bVar1;
  }
  return;
}

Assistant:

METHODDEF(void)
h2v1_fancy_upsample(j_decompress_ptr cinfo, jpeg_component_info *compptr,
                    JSAMPARRAY input_data, JSAMPARRAY *output_data_ptr)
{
  JSAMPARRAY output_data = *output_data_ptr;
  register JSAMPROW inptr, outptr;
  register int invalue;
  register JDIMENSION colctr;
  int inrow;

  for (inrow = 0; inrow < cinfo->max_v_samp_factor; inrow++) {
    inptr = input_data[inrow];
    outptr = output_data[inrow];
    /* Special case for first column */
    invalue = *inptr++;
    *outptr++ = (JSAMPLE)invalue;
    *outptr++ = (JSAMPLE)((invalue * 3 + inptr[0] + 2) >> 2);

    for (colctr = compptr->downsampled_width - 2; colctr > 0; colctr--) {
      /* General case: 3/4 * nearer pixel + 1/4 * further pixel */
      invalue = (*inptr++) * 3;
      *outptr++ = (JSAMPLE)((invalue + inptr[-2] + 1) >> 2);
      *outptr++ = (JSAMPLE)((invalue + inptr[0] + 2) >> 2);
    }

    /* Special case for last column */
    invalue = *inptr;
    *outptr++ = (JSAMPLE)((invalue * 3 + inptr[-1] + 1) >> 2);
    *outptr++ = (JSAMPLE)invalue;
  }
}